

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxOut,_cfd::js::api::DecodeRawTransactionTxOutStruct>
::DeserializeUniValue
          (JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxOut,_cfd::js::api::DecodeRawTransactionTxOutStruct>
           *this,UniValue *value)

{
  bool bVar1;
  vector<UniValue,_std::allocator<UniValue>_> *this_00;
  undefined1 local_140 [8];
  DecodeRawTransactionTxOut local_value;
  UniValue *element;
  const_iterator __end3;
  const_iterator __begin3;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  UniValue *value_local;
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxOut,_cfd::js::api::DecodeRawTransactionTxOutStruct>
  *this_local;
  
  bVar1 = UniValue::isArray(value);
  if (bVar1) {
    std::
    vector<cfd::js::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxOut>_>
    ::clear(&(this->super_JsonVector<cfd::js::api::json::DecodeRawTransactionTxOut>).
             super_vector<cfd::js::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxOut>_>
           );
    this_00 = (vector<UniValue,_std::allocator<UniValue>_> *)UniValue::getValues();
    __end3 = std::vector<UniValue,_std::allocator<UniValue>_>::begin(this_00);
    element = (UniValue *)std::vector<UniValue,_std::allocator<UniValue>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                       *)&element), bVar1) {
      local_value.script_pub_key_.addresses_.
      super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    ::operator*(&__end3);
      bVar1 = UniValue::isObject((UniValue *)
                                 local_value.script_pub_key_.addresses_.
                                 super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        js::api::json::DecodeRawTransactionTxOut::DecodeRawTransactionTxOut
                  ((DecodeRawTransactionTxOut *)local_140);
        JsonClassBase<cfd::js::api::json::DecodeRawTransactionTxOut>::DeserializeUniValue
                  ((JsonClassBase<cfd::js::api::json::DecodeRawTransactionTxOut> *)local_140,
                   (UniValue *)
                   local_value.script_pub_key_.addresses_.
                   super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<cfd::js::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxOut>_>
        ::push_back(&(this->super_JsonVector<cfd::js::api::json::DecodeRawTransactionTxOut>).
                     super_vector<cfd::js::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxOut>_>
                    ,(value_type *)local_140);
        js::api::json::DecodeRawTransactionTxOut::~DecodeRawTransactionTxOut
                  ((DecodeRawTransactionTxOut *)local_140);
      }
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++(&__end3);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (!value.isArray()) {
      return;
    }
    std::vector<TYPE>::clear();
    for (const auto& element : value.getValues()) {
      if (element.isObject()) {
        TYPE local_value;
        local_value.DeserializeUniValue(element);
        std::vector<TYPE>::push_back(local_value);
      }
    }
  }